

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O1

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  Value *cond;
  int extraout_EAX;
  MatchInstr *this_00;
  BasicBlock *pBVar1;
  Constant *label;
  BasicBlock *bb;
  long *plVar2;
  undefined4 in_register_00000034;
  long lVar3;
  const_iterator __end3;
  long *plVar4;
  IRBuilder *pIVar5;
  string local_70;
  BasicBlock *local_50;
  long local_48;
  IRBuilder *local_40;
  long *local_38;
  
  lVar3 = CONCAT44(in_register_00000034,__fd);
  (**(code **)(**(long **)(lVar3 + 0x40) + 0x10))(*(long **)(lVar3 + 0x40),this);
  cond = this->result_;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"match.cont","");
  pIVar5 = &this->super_IRBuilder;
  local_50 = IRBuilder::createBlock(pIVar5,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  this_00 = IRBuilder::createMatch(pIVar5,*(MatchClass *)(lVar3 + 0x48),cond);
  local_38 = (long *)(lVar3 + 0x50);
  plVar2 = *(long **)(lVar3 + 0x50);
  local_48 = lVar3;
  if (plVar2 != local_38) {
    do {
      local_40 = pIVar5;
      pIVar5 = local_40;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"match.case","");
      pBVar1 = IRBuilder::createBlock(pIVar5,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      IRBuilder::setInsertPoint(pIVar5,pBVar1);
      plVar4 = (long *)plVar2[5];
      if (plVar4 == (long *)0x0) {
        this->result_ = (Value *)0x0;
      }
      else {
        (**(code **)(*plVar4 + 0x10))(plVar4,this);
      }
      IRBuilder::createBr(pIVar5,local_50);
      for (plVar4 = (long *)plVar2[2]; plVar4 != plVar2 + 2; plVar4 = (long *)*plVar4) {
        label = getConstant(this,(Expr *)plVar4[2]);
        MatchInstr::addCase(this_00,label,pBVar1);
      }
      plVar2 = (long *)*plVar2;
      pIVar5 = local_40;
    } while (plVar2 != local_38);
  }
  lVar3 = local_48;
  pBVar1 = local_50;
  bb = local_50;
  if (*(long *)(local_48 + 0x68) != 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"match.else","");
    bb = IRBuilder::createBlock(pIVar5,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    IRBuilder::setInsertPoint(pIVar5,bb);
    plVar2 = *(long **)(lVar3 + 0x68);
    if (plVar2 == (long *)0x0) {
      this->result_ = (Value *)0x0;
    }
    else {
      (**(code **)(*plVar2 + 0x10))(plVar2,this);
    }
    IRBuilder::createBr(pIVar5,pBVar1);
  }
  MatchInstr::setElseBlock(this_00,bb);
  IRBuilder::setInsertPoint(pIVar5,pBVar1);
  return extraout_EAX;
}

Assistant:

void IRGenerator::accept(MatchStmt& matchStmt) {
  Value* cond = codegen(matchStmt.condition());
  BasicBlock* contBlock = createBlock("match.cont");
  MatchInstr* matchInstr = createMatch(matchStmt.op(), cond);

  for (const MatchStmt::Case& one : matchStmt.cases()) {
    BasicBlock* bb = createBlock("match.case");
    setInsertPoint(bb);
    codegen(one.second.get());
    createBr(contBlock);

    for (auto& labelNode : one.first) {
      Constant* label = getConstant(labelNode.get());
      matchInstr->addCase(label, bb);
    }
  }

  if (matchStmt.elseStmt()) {
    BasicBlock* elseBlock = createBlock("match.else");
    setInsertPoint(elseBlock);
    codegen(matchStmt.elseStmt());
    createBr(contBlock);

    matchInstr->setElseBlock(elseBlock);
  } else {
    matchInstr->setElseBlock(contBlock);
  }

  setInsertPoint(contBlock);
}